

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O3

int __thiscall Server::close(Server *this,int __fd)

{
  pointer psVar1;
  int extraout_EAX;
  shared_ptr<ClientSocket> *clientSocket;
  pointer psVar2;
  
  if (this->_socket != 0) {
    ::close(this->_socket);
  }
  psVar1 = (this->_clientSockets).
           super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->_clientSockets).
                super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    ClientSocket::close((psVar2->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,__fd);
  }
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::clear
            (&this->_clientSockets);
  return extraout_EAX;
}

Assistant:

void Server::close()
{
  if( _socket )
    ::close( _socket );

  for( auto&& clientSocket : _clientSockets )
    clientSocket->close();

  _clientSockets.clear();
}